

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
            *this,int i)

{
  FadExpr<FadUnaryMin<Fad<double>_>_> local_38;
  Fad<double> local_30;
  
  FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_30,&this->right_->fadexpr_,i);
  local_38.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)(FadUnaryMin<Fad<double>_>)&local_30;
  Fad<double>::Fad<FadUnaryMin<Fad<double>>>(__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_30);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return - right_.fastAccessDx(i);}